

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupCones_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                        Vec_Ptr_t *vRoots)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Ptr_t *vRoots_local;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsRo(p,pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsPi(p,pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                          ,0xd66,
                          "void Gia_ManDupCones_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          Vec_PtrPush(vLeaves,pObj);
        }
        else {
          pGVar2 = Gia_ObjRoToRi(p,pObj);
          Vec_PtrPush(vRoots,pGVar2);
        }
      }
      else {
        pGVar2 = Gia_ObjFanin0(pObj);
        Gia_ManDupCones_rec(p,pGVar2,vLeaves,vNodes,vRoots);
      }
    }
    else {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManDupCones_rec(p,pGVar2,vLeaves,vNodes,vRoots);
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_ManDupCones_rec(p,pGVar2,vLeaves,vNodes,vRoots);
      Vec_PtrPush(vNodes,pObj);
    }
  }
  return;
}

Assistant:

void Gia_ManDupCones_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManDupCones_rec( p, Gia_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Gia_ManDupCones_rec( p, Gia_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Gia_ObjIsCo(pObj) )
        Gia_ManDupCones_rec( p, Gia_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_PtrPush( vRoots, Gia_ObjRoToRi(p, pObj) );
    else if ( Gia_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}